

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

int jacobi_symbol(int q,int p)

{
  int iVar1;
  double dVar2;
  int local_cc;
  int local_c8;
  int value;
  int power [20];
  int nleft;
  int nfactor;
  int l;
  int i;
  int factor [20];
  int local_c;
  int p_local;
  int q_local;
  
  if (p < 2) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_SYMBOL - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  P must be greater than 1.\n");
    exit(1);
  }
  i4_factor(p,0x14,power + 0x13,&l,&local_c8,power + 0x12);
  local_c = q;
  if (power[0x12] == 1) {
    for (; local_c < 0; local_c = local_c + p) {
    }
    local_cc = 1;
    nfactor = 0;
    while( true ) {
      if (power[0x13] <= nfactor) {
        return local_cc;
      }
      iVar1 = legendre_symbol(local_c,(&l)[nfactor]);
      if (iVar1 < -1) break;
      dVar2 = pow((double)iVar1,(double)(&local_c8)[nfactor]);
      local_cc = local_cc * (int)dVar2;
      nfactor = nfactor + 1;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_SYMBOL - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Error during Legendre symbol calculation.\n");
    exit(1);
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"JACOBI_SYMBOL - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Not enough factorization space.\n");
  exit(1);
}

Assistant:

int jacobi_symbol ( int q, int p )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_SYMBOL evaluates the Jacobi symbol (Q/P).
//
//  Discussion:
//
//    If P is prime, then
//
//      Jacobi Symbol (Q/P) = Legendre Symbol (Q/P)
//
//    Else
//
//      let P have the prime factorization
//
//        P = Product ( 1 <= I <= N ) P(I)^E(I)
//
//      Jacobi Symbol (Q/P) =
//
//        Product ( 1 <= I <= N ) Legendre Symbol (Q/P(I))^E(I)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    30 June 2000
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Daniel Zwillinger,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996, pages 86-87.
//
//  Parameters:
//
//    Input, int Q, an integer whose Jacobi symbol with
//    respect to P is desired.
//
//    Input, int P, the number with respect to which the Jacobi
//    symbol of Q is desired.  P should be 2 or greater.
//
//    Output, int JACOBI_SYMBOL, the Jacobi symbol (Q/P).
//    Ordinarily, L will be -1, 0 or 1.
//    If JACOBI_SYMBOL is -10, an error occurred.
//
{
# define FACTOR_MAX 20

  int factor[FACTOR_MAX];
  int i;
  int l;
  int nfactor;
  int nleft;
  int power[FACTOR_MAX];
  int value;
//
//  P must be greater than 1.
//
  if ( p <= 1 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SYMBOL - Fatal error!\n";
    std::cerr << "  P must be greater than 1.\n";
    exit ( 1 );
  }
//
//  Decompose P into factors of prime powers.
//
  i4_factor ( p, FACTOR_MAX, nfactor, factor, power, nleft );

  if ( nleft != 1 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SYMBOL - Fatal error!\n";
    std::cerr << "  Not enough factorization space.\n";
    exit ( 1 );
  }
//
//  Force Q to be nonnegative.
//
  while ( q < 0 )
  {
    q = q + p;
  }
//
//  For each prime factor, compute the Legendre symbol, and
//  multiply the Jacobi symbol by the appropriate factor.
//
  value = 1;

  for ( i = 0; i < nfactor; i++ )
  {
    l = legendre_symbol ( q, factor[i] );

    if ( l < -1 )
    {
      std::cerr << "\n";
      std::cerr << "JACOBI_SYMBOL - Fatal error!\n";
      std::cerr << "  Error during Legendre symbol calculation.\n";
      exit ( 1 );
    }
    value = value * int(pow ( double(l), power[i] ));
  }

  return value;
# undef FACTOR_MAX
}